

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_173::PCVScanner::PCVScanner
          (PCVScanner *this,PCVFunctionStructValuesMap *functionNewInfos,
          PCVFunctionStructValuesMap *functionSetInfos,
          BoolFunctionStructValuesMap *functionCopyInfos)

{
  BoolFunctionStructValuesMap *functionCopyInfos_local;
  PCVFunctionStructValuesMap *functionSetInfos_local;
  PCVFunctionStructValuesMap *functionNewInfos_local;
  PCVScanner *this_local;
  
  StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
  ::StructScanner(&this->
                   super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                  ,functionNewInfos,functionSetInfos);
  (this->super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>)
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)&PTR__PCVScanner_0309a900;
  this->functionCopyInfos = functionCopyInfos;
  return;
}

Assistant:

PCVScanner(PCVFunctionStructValuesMap& functionNewInfos,
             PCVFunctionStructValuesMap& functionSetInfos,
             BoolFunctionStructValuesMap& functionCopyInfos)
    : StructUtils::StructScanner<PossibleConstantValues, PCVScanner>(
        functionNewInfos, functionSetInfos),
      functionCopyInfos(functionCopyInfos) {}